

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O2

void time_format(char *buf,size_t size,timespec ts)

{
  int iVar1;
  tm *__tp;
  size_t sVar2;
  time_t clock;
  char time_format [24];
  
  clock = size;
  __tp = localtime(&clock);
  if (__tp == (tm *)0x0) {
    builtin_strncpy(buf,"<can\'t find local time>",0x18);
  }
  else {
    iVar1 = snprintf(time_format,0x18,"%%F %%T.%09ld",ts.tv_sec);
    if (iVar1 - 0x18U < 0xffffffe9) {
      builtin_strncpy(buf,"<can\'t produce local time format>",0x22);
    }
    else {
      sVar2 = strftime(buf,0x40,time_format,__tp);
      if (sVar2 == 0) {
        builtin_strncpy(buf,"<can\'t format local time>",0x1a);
      }
    }
  }
  return;
}

Assistant:

static void time_format(char *buf, size_t size, struct timespec ts) {
    time_t clock = ts.tv_sec;
    struct tm* tm = localtime(&clock);
    if (tm == 0) {
      snprintf(buf, size, "<can't find local time>");
      return;
    }

    char time_format[24];
    int ret = snprintf(time_format, sizeof(time_format), "%%F %%T.%09ld", ts.tv_nsec);
    if (ret <= 0 || ret >= (int)sizeof(time_format)) {
      snprintf(buf, size, "<can't produce local time format>");
      return;
    }

    if (strftime(buf, size, time_format, tm) == 0) {
      snprintf(buf, size, "<can't format local time>");
      return;
    }
}